

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.cpp
# Opt level: O0

bool Diligent::PipelineResourceSignaturesCompatible
               (PipelineResourceSignatureDesc *Desc0,PipelineResourceSignatureDesc *Desc1,
               bool IgnoreSamplerDescriptions)

{
  bool bVar1;
  ImmutableSamplerDesc *Samp1;
  ImmutableSamplerDesc *Samp0;
  uint local_28;
  Uint32 s;
  Uint32 r;
  bool IgnoreSamplerDescriptions_local;
  PipelineResourceSignatureDesc *Desc1_local;
  PipelineResourceSignatureDesc *Desc0_local;
  
  if (Desc0->BindingIndex == Desc1->BindingIndex) {
    if (Desc0->NumResources == Desc1->NumResources) {
      for (local_28 = 0; local_28 < Desc0->NumResources; local_28 = local_28 + 1) {
        bVar1 = PipelineResourcesCompatible(Desc0->Resources + local_28,Desc1->Resources + local_28)
        ;
        if (!bVar1) {
          return false;
        }
      }
      if (Desc0->NumImmutableSamplers == Desc1->NumImmutableSamplers) {
        for (Samp0._4_4_ = 0; Samp0._4_4_ < Desc0->NumImmutableSamplers;
            Samp0._4_4_ = Samp0._4_4_ + 1) {
          if (Desc0->ImmutableSamplers[Samp0._4_4_].ShaderStages !=
              Desc1->ImmutableSamplers[Samp0._4_4_].ShaderStages) {
            return false;
          }
          if ((!IgnoreSamplerDescriptions) &&
             (bVar1 = SamplerDesc::operator!=
                                (&Desc0->ImmutableSamplers[Samp0._4_4_].Desc,
                                 &Desc1->ImmutableSamplers[Samp0._4_4_].Desc), bVar1)) {
            return false;
          }
        }
        Desc0_local._7_1_ = true;
      }
      else {
        Desc0_local._7_1_ = false;
      }
    }
    else {
      Desc0_local._7_1_ = false;
    }
  }
  else {
    Desc0_local._7_1_ = false;
  }
  return Desc0_local._7_1_;
}

Assistant:

bool PipelineResourceSignaturesCompatible(const PipelineResourceSignatureDesc& Desc0,
                                          const PipelineResourceSignatureDesc& Desc1,
                                          bool                                 IgnoreSamplerDescriptions) noexcept
{
    if (Desc0.BindingIndex != Desc1.BindingIndex)
        return false;

    if (Desc0.NumResources != Desc1.NumResources)
        return false;

    for (Uint32 r = 0; r < Desc0.NumResources; ++r)
    {
        if (!PipelineResourcesCompatible(Desc0.Resources[r], Desc1.Resources[r]))
            return false;
    }

    if (Desc0.NumImmutableSamplers != Desc1.NumImmutableSamplers)
        return false;

    for (Uint32 s = 0; s < Desc0.NumImmutableSamplers; ++s)
    {
        const ImmutableSamplerDesc& Samp0 = Desc0.ImmutableSamplers[s];
        const ImmutableSamplerDesc& Samp1 = Desc1.ImmutableSamplers[s];

        if (Samp0.ShaderStages != Samp1.ShaderStages)
            return false;

        if (!IgnoreSamplerDescriptions && Samp0.Desc != Samp1.Desc)
            return false;
    }

    return true;
}